

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millerrabin.c
# Opt level: O2

uint miller_rabin_checks_needed(uint bits)

{
  uint uVar1;
  
  if (bits < 0x514) {
    if (bits < 0x352) {
      if (bits < 0x28a) {
        if (bits < 0x226) {
          if (bits < 0x1c2) {
            if (bits < 400) {
              if (bits < 0x15e) {
                if (bits < 300) {
                  if (bits < 0xfa) {
                    if (bits < 200) {
                      return (uint)(bits < 0x96) * 9 + 0x12;
                    }
                    uVar1 = 0xf;
                  }
                  else {
                    uVar1 = 0xc;
                  }
                }
                else {
                  uVar1 = 9;
                }
              }
              else {
                uVar1 = 8;
              }
            }
            else {
              uVar1 = 7;
            }
          }
          else {
            uVar1 = 6;
          }
        }
        else {
          uVar1 = 5;
        }
      }
      else {
        uVar1 = 4;
      }
    }
    else {
      uVar1 = 3;
    }
  }
  else {
    uVar1 = 2;
  }
  return uVar1;
}

Assistant:

unsigned miller_rabin_checks_needed(unsigned bits)
{
    /* Table 4.4 from Handbook of Applied Cryptography */
    return (bits >= 1300 ?  2 : bits >= 850 ?  3 : bits >= 650 ?  4 :
            bits >=  550 ?  5 : bits >= 450 ?  6 : bits >= 400 ?  7 :
            bits >=  350 ?  8 : bits >= 300 ?  9 : bits >= 250 ? 12 :
            bits >=  200 ? 15 : bits >= 150 ? 18 : 27);
}